

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2UTF8(void)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char utf8_pattern [6];
  string s;
  char utf8_string [10];
  RE2 re_test4;
  RE2 re_test6;
  RE2 re_test8;
  RE2 re_test5;
  RE2 re_test2;
  RE2 re_test7;
  RE2 re_test3;
  RE2 re_test1;
  char local_8e8 [8];
  Arg local_8e0;
  undefined1 local_8d0 [16];
  Arg local_8c0;
  undefined1 local_8b0 [16];
  Arg *local_8a0 [46];
  RE2 local_730;
  RE2 local_650;
  RE2 local_570;
  RE2 local_490;
  RE2 local_3b0;
  RE2 local_2d0;
  RE2 local_1f0;
  RE2 local_110;
  
  local_8c0.arg_ = (void *)0xaae8ac9ce6a597e6;
  local_8c0.parser_._0_2_ = 0x9e;
  builtin_strncpy(local_8e8,".本.",6);
  local_3b0.pattern_._M_dataplus._M_p = ".........";
  local_3b0.pattern_._M_string_length._0_4_ = 9;
  RE2::Options::Options((Options *)local_8b0,Latin1);
  RE2::RE2(&local_110,(StringPiece *)&local_3b0,(Options *)local_8b0);
  sVar4 = strlen((char *)&local_8c0);
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  bVar2 = RE2::FullMatchN((StringPiece *)local_8b0,&local_110,(Arg **)0x0,0);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x43c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: RE2::FullMatch(utf8_string, re_test1)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  RE2::RE2(&local_3b0,"...");
  sVar4 = strlen((char *)&local_8c0);
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  bVar2 = RE2::FullMatchN((StringPiece *)local_8b0,&local_3b0,(Arg **)0x0,0);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x43e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: RE2::FullMatch(utf8_string, re_test2)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  local_8e0.arg_ = local_8d0;
  local_8e0.parser_ = (Parser)0x0;
  local_8d0[0] = 0;
  local_730.pattern_._M_dataplus._M_p = "(.)";
  local_730.pattern_._M_string_length = CONCAT44(local_730.pattern_._M_string_length._4_4_,3);
  RE2::Options::Options((Options *)local_8b0,Latin1);
  RE2::RE2(&local_1f0,(StringPiece *)&local_730,(Options *)local_8b0);
  sVar4 = strlen((char *)&local_8c0);
  local_730.pattern_._M_dataplus._M_p = (pointer)&local_8e0;
  local_730.pattern_._M_string_length = (size_type)RE2::Arg::parse_string;
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  local_490.pattern_._M_dataplus._M_p = (pointer)&local_730;
  bVar2 = RE2::PartialMatchN((StringPiece *)local_8b0,&local_1f0,(Arg **)&local_490,1);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x444,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),
               "Check failed: RE2::PartialMatch(utf8_string, re_test3, &s)",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  local_8b0._0_8_ = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b0,anon_var_dwarf_33466,anon_var_dwarf_33466 + 1);
  uVar1 = local_8b0._0_8_;
  if (local_8e0.parser_ == (Parser)CONCAT44(local_8b0._12_4_,local_8b0._8_4_)) {
    if (local_8e0.parser_ == (Parser)0x0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp(local_8e0.arg_,(void *)local_8b0._0_8_,(size_t)local_8e0.parser_);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((Arg **)uVar1 != local_8a0) {
    operator_delete((void *)uVar1);
  }
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x445,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: (s) == (string(\"\\xe6\"))",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  RE2::RE2(&local_730,"(.)");
  sVar4 = strlen((char *)&local_8c0);
  local_490.pattern_._M_dataplus._M_p = (pointer)&local_8e0;
  local_490.pattern_._M_string_length = (size_type)RE2::Arg::parse_string;
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  local_650.pattern_._M_dataplus._M_p = (pointer)&local_490;
  bVar2 = RE2::PartialMatchN((StringPiece *)local_8b0,&local_730,(Arg **)&local_650,1);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x447,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),
               "Check failed: RE2::PartialMatch(utf8_string, re_test4, &s)",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  local_8b0._0_8_ = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b0,anon_var_dwarf_3348a,anon_var_dwarf_3348a + 3);
  uVar1 = local_8b0._0_8_;
  if (local_8e0.parser_ == (Parser)CONCAT44(local_8b0._12_4_,local_8b0._8_4_)) {
    if (local_8e0.parser_ == (Parser)0x0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp(local_8e0.arg_,(void *)local_8b0._0_8_,(size_t)local_8e0.parser_);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((Arg **)uVar1 != local_8a0) {
    operator_delete((void *)uVar1);
  }
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x448,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: (s) == (string(\"\\xe6\\x97\\xa5\"))",0x2d)
    ;
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  local_650.pattern_._M_dataplus._M_p = (pointer)&local_8c0;
  sVar4 = strlen((char *)&local_8c0);
  local_650.pattern_._M_string_length._0_4_ = (undefined4)sVar4;
  RE2::Options::Options((Options *)local_8b0,Latin1);
  RE2::RE2(&local_490,(StringPiece *)&local_650,(Options *)local_8b0);
  sVar4 = strlen((char *)&local_8c0);
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  bVar2 = RE2::FullMatchN((StringPiece *)local_8b0,&local_490,(Arg **)0x0,0);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x44c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: RE2::FullMatch(utf8_string, re_test5)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  RE2::RE2(&local_650,(char *)&local_8c0);
  sVar4 = strlen((char *)&local_8c0);
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  bVar2 = RE2::FullMatchN((StringPiece *)local_8b0,&local_650,(Arg **)0x0,0);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x44e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: RE2::FullMatch(utf8_string, re_test6)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  local_570.pattern_._M_dataplus._M_p = local_8e8;
  sVar4 = strlen(local_8e8);
  local_570.pattern_._M_string_length._0_4_ = (undefined4)sVar4;
  RE2::Options::Options((Options *)local_8b0,Latin1);
  RE2::RE2(&local_2d0,(StringPiece *)&local_570,(Options *)local_8b0);
  sVar4 = strlen((char *)&local_8c0);
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  bVar2 = RE2::FullMatchN((StringPiece *)local_8b0,&local_2d0,(Arg **)0x0,0);
  if (bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x452,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: !RE2::FullMatch(utf8_string, re_test7)",
               0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  RE2::RE2(&local_570,local_8e8);
  sVar4 = strlen((char *)&local_8c0);
  local_8b0._8_4_ = (undefined4)sVar4;
  local_8b0._0_8_ = &local_8c0;
  bVar2 = RE2::FullMatchN((StringPiece *)local_8b0,&local_570,(Arg **)0x0,0);
  if (!bVar2) {
    LogMessage::LogMessage
              ((LogMessage *)local_8b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x454,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_8b0 + 8),"Check failed: RE2::FullMatch(utf8_string, re_test8)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_8b0);
  }
  RE2::~RE2(&local_570);
  RE2::~RE2(&local_2d0);
  RE2::~RE2(&local_650);
  RE2::~RE2(&local_490);
  RE2::~RE2(&local_730);
  RE2::~RE2(&local_1f0);
  if ((undefined1 *)local_8e0.arg_ != local_8d0) {
    operator_delete(local_8e0.arg_);
  }
  RE2::~RE2(&local_3b0);
  RE2::~RE2(&local_110);
  return;
}

Assistant:

TEST(RE2, UTF8) {
  // Check UTF-8 handling
  // Three Japanese characters (nihongo)
  const char utf8_string[] = {
       (char)0xe6, (char)0x97, (char)0xa5, // 65e5
       (char)0xe6, (char)0x9c, (char)0xac, // 627c
       (char)0xe8, (char)0xaa, (char)0x9e, // 8a9e
       0
  };
  const char utf8_pattern[] = {
       '.',
       (char)0xe6, (char)0x9c, (char)0xac, // 627c
       '.',
       0
  };

  // Both should match in either mode, bytes or UTF-8
  RE2 re_test1(".........", RE2::Latin1);
  CHECK(RE2::FullMatch(utf8_string, re_test1));
  RE2 re_test2("...");
  CHECK(RE2::FullMatch(utf8_string, re_test2));

  // Check that '.' matches one byte or UTF-8 character
  // according to the mode.
  string s;
  RE2 re_test3("(.)", RE2::Latin1);
  CHECK(RE2::PartialMatch(utf8_string, re_test3, &s));
  CHECK_EQ(s, string("\xe6"));
  RE2 re_test4("(.)");
  CHECK(RE2::PartialMatch(utf8_string, re_test4, &s));
  CHECK_EQ(s, string("\xe6\x97\xa5"));

  // Check that string matches itself in either mode
  RE2 re_test5(utf8_string, RE2::Latin1);
  CHECK(RE2::FullMatch(utf8_string, re_test5));
  RE2 re_test6(utf8_string);
  CHECK(RE2::FullMatch(utf8_string, re_test6));

  // Check that pattern matches string only in UTF8 mode
  RE2 re_test7(utf8_pattern, RE2::Latin1);
  CHECK(!RE2::FullMatch(utf8_string, re_test7));
  RE2 re_test8(utf8_pattern);
  CHECK(RE2::FullMatch(utf8_string, re_test8));
}